

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void dynet::logsumexp<dynet::Device_CPU>(Device_CPU *dev,Tensor *x,Tensor *m,Tensor *z)

{
  TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *pTVar1;
  Tensor *this;
  Tensor *pTVar2;
  size_t b;
  ulong uVar3;
  real rVar4;
  vector<float,_std::allocator<float>_> mvals;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_d8;
  ulong local_c8;
  _Vector_base<float,_std::allocator<float>_> local_b8;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_a0;
  Index local_90;
  undefined1 local_88 [72];
  Device *local_40;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *local_38;
  
  if ((x->d).bd == 1) {
    this = x;
    local_88._0_16_ = (undefined1  [16])Tensor::t<1>(x);
    pTVar2 = (Tensor *)local_88;
    local_b8._M_impl.super__Vector_impl_data._M_start =
         (pointer)Tensor::t<0>((TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *
                               )m,this);
    local_d8.m_dimensions.super_array<long,_1>._M_elems[0] = (array<long,_1>)&local_b8;
    local_d8.m_data = (StoragePointerType)dev->edevice;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                 *)&local_d8,
                (TensorReductionOp<Eigen::internal::MaxReducer<float,_0>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>
                 *)pTVar2);
    rVar4 = as_scalar(m);
    local_88._0_16_ = (undefined1  [16])Tensor::t<1>(x);
    local_88._16_4_ = rVar4;
    local_b8._M_impl.super__Vector_impl_data._M_start =
         (pointer)Tensor::t<0>((TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *
                               )z,pTVar2);
    pTVar2 = (Tensor *)local_88;
    local_d8.m_data = (StoragePointerType)dev->edevice;
    local_d8.m_dimensions.super_array<long,_1>._M_elems[0] =
         (array<long,_1>)(array<long,_1>)&local_b8;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                 *)&local_d8,
                (TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::MakePointer>
                 *)pTVar2);
    pTVar1 = Tensor::t<0>((TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *)z,
                          pTVar2);
    local_88._0_8_ = pTVar1;
    local_88._24_4_ = rVar4;
    local_b8._M_impl.super__Vector_impl_data._M_start =
         (pointer)Tensor::t<0>((TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *
                               )z,pTVar2);
    local_d8.m_dimensions.super_array<long,_1>._M_elems[0] =
         (array<long,_1>)(array<long,_1>)&local_b8;
    local_d8.m_data = (StoragePointerType)dev->edevice;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                 *)&local_d8,
                (TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_sum_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>_>_>
                 *)local_88);
  }
  else {
    Tensor::tb<1>((TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)&local_d8,x)
    ;
    local_88._16_8_ = local_c8;
    local_88._0_8_ = local_d8.m_data;
    local_88._8_8_ = local_d8.m_dimensions.super_array<long,_1>._M_elems[0];
    local_88._24_8_ = (ulong)(uint)local_88._28_4_ << 0x20;
    local_a0 = Tensor::tb<0>(m);
    local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)dev->edevice;
    local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_a0;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                 *)&local_b8,
                (TensorReductionOp<Eigen::internal::MaxReducer<float,_0>,_const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>
                 *)local_88);
    as_vector((vector<float,_std::allocator<float>_> *)&local_b8,m);
    for (uVar3 = 0; uVar3 < (x->d).bd; uVar3 = uVar3 + 1) {
      Tensor::tb<1>((TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)&local_a0,
                    x);
      local_88._40_4_ =
           *(undefined4 *)((long)local_b8._M_impl.super__Vector_impl_data._M_start + uVar3 * 4);
      local_88._0_8_ = local_a0.m_data;
      local_88._8_8_ = local_a0.m_dimensions.super_array<long,_1>._M_elems[0];
      local_88._16_8_ = local_90;
      local_88._24_8_ = uVar3;
      local_d8 = Tensor::tb<0>(z);
      local_38 = (TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)&local_d8;
      local_40 = (Device *)dev->edevice;
      local_c8 = uVar3;
      Eigen::
      TensorDevice<Eigen::TensorChippingOp<0l,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
      ::operator=((TensorDevice<Eigen::TensorChippingOp<0l,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
                   *)&local_40,
                  (TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorChippingOp<1L,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::MakePointer>
                   *)local_88);
      local_88._0_16_ = (undefined1  [16])Tensor::tb<0>(z);
      local_88._40_4_ =
           *(undefined4 *)((long)local_b8._M_impl.super__Vector_impl_data._M_start + uVar3 * 4);
      local_88._16_8_ = uVar3;
      local_d8 = Tensor::tb<0>(z);
      local_a0.m_dimensions.super_array<long,_1>._M_elems[0] =
           (array<long,_1>)(array<long,_1>)&local_d8;
      local_a0.m_data = (StoragePointerType)dev->edevice;
      local_c8 = uVar3;
      Eigen::
      TensorDevice<Eigen::TensorChippingOp<0l,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
      ::operator=((TensorDevice<Eigen::TensorChippingOp<0l,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
                   *)&local_a0,
                  (TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_sum_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorChippingOp<0L,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>
                   *)local_88);
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_b8);
  }
  return;
}

Assistant:

EIGEN_STRONG_INLINE void logsumexp(const MyDevice & dev, const Tensor& x, Tensor & m, Tensor& z) {

  if(x.d.bd == 1) {
    m.t<0>().device(*dev.edevice) = x.t<1>().maximum();
    float mval = as_scalar(m);
    // This needs to be split into two lines to prevent memory allocation
    z.t<0>().device(*dev.edevice) = (x.t<1>() - mval).exp().sum();
    z.t<0>().device(*dev.edevice) = z.t<0>().log() + mval;
  } else {
    Eigen::array<int, 1> red_axis; red_axis[0] = 0;
    m.tb<0>().device(*dev.edevice) = x.tb<1>().maximum(red_axis);
    // TODO: We want to do this in a single command, but this is causing incorrect results.
    //  Eigen::array<int, 2> bcast({(int)x.d.rows(), 1});
    //  z.tb<0>().device(*dev.edevice) = (x.tb<1>() - m.tb<1>().broadcast(bcast)).exp().sum();
    //  z.tb<0>().device(*dev.edevice) = z.tb<0>().log() + m.tb<0>();
    // Do the following instead
    vector<float> mvals = as_vector(m);
    for(size_t b = 0; b < x.d.bd; b++) {
      // This needs to be split into two lines to prevent memory allocation
      z.tb<0>().chip<0>(b).device(*dev.edevice) = (x.tb<1>().chip<1>(b) - mvals[b]).exp().sum();
      z.tb<0>().chip<0>(b).device(*dev.edevice) = z.tb<0>().chip<0>(b).log() + mvals[b];
    }
  }
}